

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

void __thiscall jpgd::jpeg_decoder::transform_mcu(jpeg_decoder *this,int mcu_row)

{
  undefined1 uVar1;
  jpgd_block_coeff_t *pjVar2;
  uint8 *puVar3;
  uint8 uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int *piVar10;
  uint8_t *pDst_ptr;
  long lVar11;
  jpgd_block_coeff_t *pInput;
  short *pSrc;
  uint8_t *pOutputUB;
  uint uVar12;
  undefined1 *puVar13;
  int local_138 [66];
  
  iVar9 = mcu_row * this->m_blocks_per_mcu;
  if (this->m_max_blocks_per_row <= iVar9) {
    stop_decoding(this,JPGD_DECODE_ERROR);
  }
  if (0 < this->m_blocks_per_mcu) {
    pjVar2 = this->m_pMCU_coefficients;
    puVar3 = this->m_pSample_buf;
    pOutputUB = puVar3 + iVar9 * 0x40;
    lVar11 = 0;
    pInput = pjVar2;
    do {
      uVar12 = this->m_mcu_block_max_zag[lVar11];
      if ((int)uVar12 < 1) {
        __assert_fail("block_max_zag >= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                      ,0x11f,"void jpgd::idct(const jpgd_block_coeff_t *, uint8 *, int, bool)");
      }
      if (0x40 < uVar12) {
        __assert_fail("block_max_zag <= 64",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                      ,0x120,"void jpgd::idct(const jpgd_block_coeff_t *, uint8 *, int, bool)");
      }
      if (uVar12 == 1) {
        iVar5 = *pInput + 4 >> 3;
        iVar9 = 0;
        if (-0x81 < iVar5) {
          iVar9 = 0xff;
        }
        if ((char)iVar5 == iVar5) {
          iVar9 = iVar5 + 0x80;
        }
        iVar9 = iVar9 * 0x1010101;
        lVar6 = 0;
        do {
          piVar10 = (int *)(pOutputUB + lVar6 * 8);
          *piVar10 = iVar9;
          piVar10[1] = iVar9;
          piVar10[2] = iVar9;
          piVar10[3] = iVar9;
          lVar6 = lVar6 + 2;
        } while (lVar6 != 8);
      }
      else if (((this->m_flags & 2) == 0 & this->m_has_sse2) == 0) {
        puVar13 = s_idct_row_table + (ulong)(uVar12 - 1) * 8;
        uVar8 = 9;
        piVar10 = local_138;
        pSrc = pInput;
        do {
          switch(*puVar13) {
          case 1:
            iVar9 = (int)*pSrc;
            *piVar10 = iVar9 << 2;
            piVar10[1] = iVar9 << 2;
            piVar10[2] = iVar9 << 2;
            piVar10[3] = iVar9 << 2;
            piVar10[4] = iVar9 << 2;
            piVar10[5] = iVar9 << 2;
            piVar10[6] = iVar9 << 2;
            piVar10[7] = iVar9 << 2;
            break;
          case 2:
            Row<2>::idct(piVar10,pSrc);
            break;
          case 3:
            Row<3>::idct(piVar10,pSrc);
            break;
          case 4:
            Row<4>::idct(piVar10,pSrc);
            break;
          case 5:
            Row<5>::idct(piVar10,pSrc);
            break;
          case 6:
            Row<6>::idct(piVar10,pSrc);
            break;
          case 7:
            Row<7>::idct(piVar10,pSrc);
            break;
          case 8:
            Row<8>::idct(piVar10,pSrc);
          }
          pSrc = pSrc + 8;
          piVar10 = piVar10 + 8;
          puVar13 = puVar13 + 1;
          uVar8 = uVar8 - 1;
        } while (1 < uVar8);
        uVar1 = s_idct_col_table[uVar12 - 1];
        uVar12 = 9;
        piVar10 = local_138;
        pDst_ptr = pOutputUB;
        do {
          switch(uVar1) {
          case 1:
            uVar7 = *piVar10 + 0x1010 >> 5;
            uVar8 = (uint)(byte)-(-0x1011 < *piVar10);
            if (uVar7 < 0x100) {
              uVar8 = uVar7;
            }
            uVar4 = (uint8)uVar8;
            *pDst_ptr = uVar4;
            pDst_ptr[8] = uVar4;
            pDst_ptr[0x10] = uVar4;
            pDst_ptr[0x18] = uVar4;
            pDst_ptr[0x20] = uVar4;
            pDst_ptr[0x28] = uVar4;
            pDst_ptr[0x30] = uVar4;
            pDst_ptr[0x38] = uVar4;
            break;
          case 2:
            Col<2>::idct(pDst_ptr,piVar10);
            break;
          case 3:
            Col<3>::idct(pDst_ptr,piVar10);
            break;
          case 4:
            Col<4>::idct(pDst_ptr,piVar10);
            break;
          case 5:
            Col<5>::idct(pDst_ptr,piVar10);
            break;
          case 6:
            Col<6>::idct(pDst_ptr,piVar10);
            break;
          case 7:
            Col<7>::idct(pDst_ptr,piVar10);
            break;
          case 8:
            Col<8>::idct(pDst_ptr,piVar10);
          }
          piVar10 = piVar10 + 1;
          pDst_ptr = pDst_ptr + 1;
          uVar12 = uVar12 - 1;
        } while (1 < uVar12);
      }
      else {
        if (((ulong)pjVar2 & 0xf) != 0) {
          __assert_fail("(((uintptr_t)pSrc_ptr) & 15) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                        ,0x135,"void jpgd::idct(const jpgd_block_coeff_t *, uint8 *, int, bool)");
        }
        if (((ulong)puVar3 & 0xf) != 0) {
          __assert_fail("(((uintptr_t)pDst_ptr) & 15) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                        ,0x136,"void jpgd::idct(const jpgd_block_coeff_t *, uint8 *, int, bool)");
        }
        idctSSEShortU8(pInput,pOutputUB);
      }
      pInput = pInput + 0x40;
      pOutputUB = pOutputUB + 0x40;
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->m_blocks_per_mcu);
  }
  return;
}

Assistant:

void jpeg_decoder::transform_mcu(int mcu_row)
	{
		jpgd_block_coeff_t* pSrc_ptr = m_pMCU_coefficients;
		if (mcu_row * m_blocks_per_mcu >= m_max_blocks_per_row)
			stop_decoding(JPGD_DECODE_ERROR);

		uint8* pDst_ptr = m_pSample_buf + mcu_row * m_blocks_per_mcu * 64;

		for (int mcu_block = 0; mcu_block < m_blocks_per_mcu; mcu_block++)
		{
			idct(pSrc_ptr, pDst_ptr, m_mcu_block_max_zag[mcu_block], ((m_flags & cFlagDisableSIMD) == 0) && m_has_sse2);
			pSrc_ptr += 64;
			pDst_ptr += 64;
		}
	}